

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void pubkey_show(Curl_easy *data,BIO *mem,int num,char *type,char *name,BIGNUM *bn)

{
  size_t valuelen;
  char *ptr;
  char namebuf [32];
  char *local_50;
  char local_48 [40];
  
  curl_msnprintf(local_48,0x20,"%s(%s)");
  if (bn != (BIGNUM *)0x0) {
    BN_print(mem,(BIGNUM *)bn);
  }
  valuelen = BIO_ctrl((BIO *)mem,3,0,&local_50);
  Curl_ssl_push_certinfo_len(data,num,local_48,local_50,valuelen);
  BIO_ctrl((BIO *)mem,1,0,(void *)0x0);
  return;
}

Assistant:

static void pubkey_show(struct Curl_easy *data,
                        BIO *mem,
                        int num,
                        const char *type,
                        const char *name,
#ifdef HAVE_OPAQUE_RSA_DSA_DH
                        const
#endif
                        BIGNUM *bn)
{
  char *ptr;
  char namebuf[32];

  snprintf(namebuf, sizeof(namebuf), "%s(%s)", type, name);

  if(bn)
    BN_print(mem, bn);
  push_certinfo(namebuf, num);
}